

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

sub_form __thiscall goodform::sub_form::at(sub_form *this,size_t index,any *default_variant)

{
  pointer paVar1;
  array_validator aVar2;
  sub_form sVar3;
  vector<std::any,_std::allocator<std::any>_> local_38;
  
  local_38.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  aVar2 = array(this,&local_38);
  sVar3.error_ = aVar2.error_;
  paVar1 = ((aVar2.value_)->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (ulong)((long)((aVar2.value_)->super__Vector_base<std::any,_std::allocator<std::any>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 4)) {
    default_variant = paVar1 + index;
  }
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_38);
  sVar3.variant_ = default_variant;
  return sVar3;
}

Assistant:

sub_form sub_form::at(size_t index, const any& default_variant)
  {
    return this->array(std::vector<any>()).at(index, default_variant);
  }